

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_RegVm.cpp
# Opt level: O1

void __thiscall ExecutorRegVm::Stop(ExecutorRegVm *this,NULLCRef error)

{
  nullres nVar1;
  NULLCRef *pNVar2;
  NULLCRef in_stack_ffffffffffffffe0;
  
  this->codeRunning = false;
  this->callContinue = false;
  if (error.typeID < this->exTypes->count) {
    pNVar2 = &error;
    NULLC::SafeSprintf(this->execErrorBuffer,0x10000,"%s",
                       (this->exLinker->exSymbols).data +
                       this->exTypes->data[error.typeID].offsetToName);
    this->execErrorMessage = this->execErrorBuffer;
    nVar1 = nullcIsStackPointer((void *)CONCAT44(error.ptr._4_4_,error.ptr._0_4_));
    if (nVar1 != '\0') {
      pNVar2 = (NULLCRef *)&stack0xffffffffffffffe4;
      NULLC::CopyObject(in_stack_ffffffffffffffe0);
    }
    *(undefined4 *)((long)&(this->execErrorObject).ptr + 4) =
         *(undefined4 *)((long)&pNVar2->ptr + 4);
    *(undefined8 *)&this->execErrorObject = *(undefined8 *)pNVar2;
    return;
  }
  __assert_fail("index < count",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x7f,
                "T &FastVector<ExternTypeInfo>::operator[](unsigned int) [T = ExternTypeInfo, zeroNewMemory = false, skipConstructor = false]"
               );
}

Assistant:

void ExecutorRegVm::Stop(NULLCRef error)
{
	codeRunning = false;

	callContinue = false;

	NULLC::SafeSprintf(execErrorBuffer, NULLC_ERROR_BUFFER_SIZE, "%s", exLinker->exSymbols.data + exTypes[error.typeID].offsetToName);

	execErrorMessage = execErrorBuffer;

	if(nullcIsStackPointer(error.ptr))
		execErrorObject = NULLC::CopyObject(error);
	else
		execErrorObject = error;
}